

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O0

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::DestroyCommandQueues
          (RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           *this)

{
  IMemoryAllocator *pIVar1;
  size_t sVar2;
  Char *pCVar3;
  undefined1 local_70 [8];
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  CommandQueue *Queue;
  size_t q;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *this_local;
  
  if (this->m_CommandQueues != (CommandQueue *)0x0) {
    for (Queue = (CommandQueue *)0x0; Queue < (CommandQueue *)this->m_CmdQueueCount;
        Queue = (CommandQueue *)((long)&(Queue->Mtx).super___mutex_base._M_mutex + 1)) {
      msg.field_2._8_8_ = this->m_CommandQueues + (long)Queue;
      sVar2 = ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::GetStaleResourceCount
                        (&((CommandQueue *)msg.field_2._8_8_)->ReleaseQueue);
      if (sVar2 != 0) {
        FormatString<char[71]>
                  ((string *)local_40,
                   (char (*) [71])
                   "All stale resources must be released before destroying a command queue");
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"DestroyCommandQueues",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                   ,0x124);
        std::__cxx11::string::~string((string *)local_40);
      }
      sVar2 = ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
              GetPendingReleaseResourceCount
                        ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)
                         (msg.field_2._8_8_ + 0x38));
      if (sVar2 != 0) {
        FormatString<char[65]>
                  ((string *)local_70,
                   (char (*) [65])"All resources must be released before destroying a command queue"
                  );
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"DestroyCommandQueues",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                   ,0x125);
        std::__cxx11::string::~string((string *)local_70);
      }
      CommandQueue::~CommandQueue((CommandQueue *)msg.field_2._8_8_);
    }
    pIVar1 = (this->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_RawMemAllocator;
    (*pIVar1->_vptr_IMemoryAllocator[1])(pIVar1,this->m_CommandQueues);
    this->m_CommandQueues = (CommandQueue *)0x0;
  }
  return;
}

Assistant:

void DestroyCommandQueues()
    {
        if (m_CommandQueues != nullptr)
        {
            for (size_t q = 0; q < m_CmdQueueCount; ++q)
            {
                auto& Queue = m_CommandQueues[q];
                DEV_CHECK_ERR(Queue.ReleaseQueue.GetStaleResourceCount() == 0, "All stale resources must be released before destroying a command queue");
                DEV_CHECK_ERR(Queue.ReleaseQueue.GetPendingReleaseResourceCount() == 0, "All resources must be released before destroying a command queue");
                Queue.~CommandQueue();
            }
            this->m_RawMemAllocator.Free(m_CommandQueues);
            m_CommandQueues = nullptr;
        }
    }